

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O3

uint64_t highwayhash::(anonymous_namespace)::RunHighwayCat<2u>(void *param_1,size_t size)

{
  int iVar1;
  uint64_t *packet_1;
  long *plVar2;
  __m128i *buffer;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  V128<unsigned_long> t;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar14;
  ulong uVar13;
  ulong uVar15;
  V128<unsigned_long> t_2;
  ulong uVar18;
  undefined1 auVar16 [16];
  undefined4 uVar19;
  undefined1 auVar17 [16];
  ulong uVar20;
  ulong uVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar30;
  long lVar31;
  undefined1 auVar29 [16];
  ulong uVar32;
  V128<unsigned_long> t_1;
  ulong uVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar38;
  ulong uVar39;
  HighwayHashCatT<2U> cat;
  HHPacket tmp;
  char in [1024];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  Intrinsic local_620;
  Intrinsic local_610;
  long local_600;
  long lStack_5f8;
  long local_5f0;
  long lStack_5e8;
  ulong local_5e0;
  ulong uStack_5d8;
  ulong local_5d0;
  ulong uStack_5c8;
  ulong local_5c0;
  ulong uStack_5b8;
  ulong local_5b0;
  ulong uStack_5a8;
  size_t local_5a0;
  Intrinsic local_580;
  ulong local_570;
  ulong uStack_568;
  ulong local_560;
  ulong uStack_558;
  ulong local_550;
  ulong uStack_548;
  ulong local_540;
  ulong uStack_538;
  long local_530;
  long lStack_528;
  long local_520;
  long lStack_518;
  Intrinsic local_510;
  HHStateSSE41 local_500;
  long local_480 [138];
  
  local_620 = _DAT_001133b0;
  local_610 = _DAT_001133c0;
  lVar28 = 0x3bd39e10cb0ef593;
  lVar31 = -0x3f530e974a0e7574;
  local_600 = 0x3bd39e10cb0ef593;
  lStack_5f8 = -0x3f530e974a0e7574;
  lVar25 = -0x41ab9932cb16f394;
  lVar26 = 0x452821e538d01377;
  local_5f0 = -0x41ab9932cb16f394;
  lStack_5e8 = 0x452821e538d01377;
  uVar4 = 0xdbe6d5d5fe4cce2f;
  uVar13 = 0xa4093822299f31d0;
  local_5e0 = 0xdbe6d5d5fe4cce2f;
  uStack_5d8 = 0xa4093822299f31d0;
  uVar15 = 0x13198a2e03707344;
  uVar18 = 0x243f6a8885a308d3;
  local_5d0 = 0x13198a2e03707344;
  uStack_5c8 = 0x243f6a8885a308d3;
  uVar20 = 0x3bd39e10cb0ef593;
  uVar24 = 0xc0acf169b5f18a8c;
  local_5c0 = 0x3bd39e10cb0ef593;
  uStack_5b8 = 0xc0acf169b5f18a8c;
  uVar32 = 0xbe5466cf34e90c6c;
  uVar35 = 0x452821e638d01377;
  local_5b0 = 0xbe5466cf34e90c6c;
  uStack_5a8 = 0x452821e638d01377;
  local_5a0 = 0;
  local_640 = (undefined1  [16])0x0;
  local_630 = (undefined1  [16])0x0;
  local_480[0]._0_1_ = (char)size;
  uVar5 = size >> 1;
  if (size < 0x40) {
    if (size < 2) {
      local_5a0 = 0;
    }
    else {
      memcpy(local_640,local_480,uVar5);
    }
    sVar3 = local_5a0 + uVar5;
    local_5a0 = sVar3;
  }
  else {
    plVar2 = local_480;
    local_5a0 = uVar5;
    do {
      auVar36._0_8_ = lVar28 + uVar4 + *plVar2;
      auVar36._8_8_ = lVar31 + uVar13 + plVar2[1];
      auVar33._0_8_ = lVar25 + uVar15 + plVar2[2];
      auVar33._8_8_ = lVar26 + uVar18 + plVar2[3];
      uVar14 = local_620[0]._4_4_;
      auVar6._4_4_ = uVar14;
      auVar6._0_4_ = uVar14;
      auVar6._8_4_ = local_620[1]._4_4_;
      auVar6._12_4_ = local_620[1]._4_4_;
      uVar4 = (ulong)uVar14 * (auVar36._0_8_ & 0xffffffff) ^ uVar4;
      uVar13 = (auVar6._8_8_ & 0xffffffff) * (auVar36._8_8_ & 0xffffffff) ^ uVar13;
      uVar27 = uVar32 + local_610[0];
      uVar30 = uVar35 + local_610[1];
      uVar15 = (local_610[0] >> 0x20) * (auVar33._0_8_ & 0xffffffff) ^ uVar15;
      uVar18 = (local_610[1] >> 0x20) * (auVar33._8_8_ & 0xffffffff) ^ uVar18;
      uVar38 = local_620[0] + uVar20;
      uVar39 = local_620[1] + uVar24;
      uVar14 = (uint)(auVar36._0_8_ >> 0x20);
      uVar19 = (undefined4)(auVar36._8_8_ >> 0x20);
      auVar21._4_4_ = uVar14;
      auVar21._0_4_ = uVar14;
      auVar21._8_4_ = uVar19;
      auVar21._12_4_ = uVar19;
      uVar20 = (ulong)uVar14 * (uVar38 & 0xffffffff) ^ uVar20;
      uVar24 = (auVar21._8_8_ & 0xffffffff) * (uVar39 & 0xffffffff) ^ uVar24;
      auVar6 = pshufb(auVar33,_DAT_00113230);
      local_610[0] = auVar6._0_8_ + uVar27;
      local_610[1] = auVar6._8_8_ + uVar30;
      auVar6 = pshufb((undefined1  [16])local_610,_DAT_00113230);
      lVar25 = auVar6._0_8_ + auVar33._0_8_;
      lVar26 = auVar6._8_8_ + auVar33._8_8_;
      uVar32 = (auVar33._0_8_ >> 0x20) * (uVar27 & 0xffffffff) ^ uVar32;
      uVar35 = (auVar33._8_8_ >> 0x20) * (uVar30 & 0xffffffff) ^ uVar35;
      auVar6 = pshufb(auVar36,_DAT_00113230);
      local_620[0] = auVar6._0_8_ + uVar38;
      local_620[1] = auVar6._8_8_ + uVar39;
      auVar6 = pshufb((undefined1  [16])local_620,_DAT_00113230);
      lVar28 = auVar6._0_8_ + auVar36._0_8_;
      lVar31 = auVar6._8_8_ + auVar36._8_8_;
      plVar2 = plVar2 + 4;
      local_5a0 = local_5a0 - 0x20;
    } while (0x1f < local_5a0);
    local_5f0 = lVar25;
    lStack_5e8 = lVar26;
    local_5b0 = uVar32;
    uStack_5a8 = uVar35;
    local_5e0 = uVar4;
    uStack_5d8 = uVar13;
    local_5d0 = uVar15;
    uStack_5c8 = uVar18;
    local_600 = lVar28;
    lStack_5f8 = lVar31;
    local_5c0 = uVar20;
    uStack_5b8 = uVar24;
    if (local_5a0 == 0) {
      sVar3 = 0;
    }
    else {
      memcpy(local_640,plVar2,local_5a0);
      sVar3 = local_5a0;
    }
  }
  plVar2 = (long *)((long)local_480 + uVar5);
  uVar5 = size - uVar5;
  uVar4 = 0x20 - sVar3;
  if (uVar5 < uVar4) {
    if (uVar5 != 0) {
      memcpy(local_640 + sVar3,plVar2,uVar5);
      sVar3 = local_5a0;
    }
    sVar3 = sVar3 + uVar5;
    local_5a0 = sVar3;
  }
  else {
    if (sVar3 != 0) {
      local_580[0] = local_610[0];
      local_580[1] = local_610[1];
      local_570 = local_5e0;
      uStack_568 = uStack_5d8;
      local_560 = local_5d0;
      uStack_558 = uStack_5c8;
      local_550 = local_5c0;
      uStack_548 = uStack_5b8;
      local_540 = local_5b0;
      uStack_538 = uStack_5a8;
      local_530 = local_5f0;
      lStack_528 = lStack_5e8;
      local_520 = local_600;
      lStack_518 = lStack_5f8;
      local_510[0] = local_620[0];
      local_510[1] = local_620[1];
      memcpy(&local_500,local_640,sVar3);
      if (sVar3 != 0x20) {
        memcpy((void *)((long)local_500.v0L.v_ + sVar3),plVar2,uVar4);
      }
      auVar16._0_8_ = local_520 + local_570 + local_500.v0L.v_[0];
      auVar16._8_8_ = lStack_518 + uStack_568 + local_500.v0L.v_[1];
      auVar22._0_8_ = local_530 + local_560 + local_500.v0H.v_[0];
      auVar22._8_8_ = lStack_528 + uStack_558 + local_500.v0H.v_[1];
      uVar14 = local_510[0]._4_4_;
      auVar7._4_4_ = uVar14;
      auVar7._0_4_ = uVar14;
      auVar7._8_4_ = local_510[1]._4_4_;
      auVar7._12_4_ = local_510[1]._4_4_;
      local_5e0 = local_570 ^ (ulong)uVar14 * (auVar16._0_8_ & 0xffffffff);
      uStack_5d8 = uStack_568 ^ (auVar7._8_8_ & 0xffffffff) * (auVar16._8_8_ & 0xffffffff);
      local_5d0 = local_560 ^ ((ulong)local_580[0] >> 0x20) * (auVar22._0_8_ & 0xffffffff);
      uStack_5c8 = uStack_558 ^ ((ulong)local_580[1] >> 0x20) * (auVar22._8_8_ & 0xffffffff);
      uVar13 = local_510[0] + local_550;
      uVar15 = local_510[1] + uStack_548;
      uVar14 = (uint)(auVar16._0_8_ >> 0x20);
      uVar19 = (undefined4)(auVar16._8_8_ >> 0x20);
      auVar9._4_4_ = uVar14;
      auVar9._0_4_ = uVar14;
      auVar9._8_4_ = uVar19;
      auVar9._12_4_ = uVar19;
      local_5c0 = local_550 ^ (ulong)uVar14 * (uVar13 & 0xffffffff);
      uStack_5b8 = uStack_548 ^ (auVar9._8_8_ & 0xffffffff) * (uVar15 & 0xffffffff);
      local_5b0 = local_540 ^ (auVar22._0_8_ >> 0x20) * (local_540 + local_580[0] & 0xffffffff);
      uStack_5a8 = uStack_538 ^ (auVar22._8_8_ >> 0x20) * (uStack_538 + local_580[1] & 0xffffffff);
      auVar6 = pshufb(auVar16,_DAT_00113230);
      local_620[0] = uVar13 + auVar6._0_8_;
      local_620[1] = uVar15 + auVar6._8_8_;
      auVar6 = pshufb(auVar22,_DAT_00113230);
      local_610[0] = auVar6._0_8_ + local_540 + local_580[0];
      local_610[1] = auVar6._8_8_ + uStack_538 + local_580[1];
      auVar6 = pshufb((undefined1  [16])local_620,_DAT_00113230);
      local_600 = auVar16._0_8_ + auVar6._0_8_;
      lStack_5f8 = auVar16._8_8_ + auVar6._8_8_;
      auVar6 = pshufb((undefined1  [16])local_610,_DAT_00113230);
      local_5f0 = auVar22._0_8_ + auVar6._0_8_;
      lStack_5e8 = auVar22._8_8_ + auVar6._8_8_;
      plVar2 = (long *)((long)plVar2 + uVar4);
      uVar5 = uVar5 - uVar4;
    }
    while (local_5a0 = uVar5, 0x1f < local_5a0) {
      auVar17._0_8_ = local_600 + local_5e0 + *plVar2;
      auVar17._8_8_ = lStack_5f8 + uStack_5d8 + plVar2[1];
      auVar23._0_8_ = local_5f0 + local_5d0 + plVar2[2];
      auVar23._8_8_ = lStack_5e8 + uStack_5c8 + plVar2[3];
      uVar14 = local_620[0]._4_4_;
      auVar10._4_4_ = uVar14;
      auVar10._0_4_ = uVar14;
      auVar10._8_4_ = local_620[1]._4_4_;
      auVar10._12_4_ = local_620[1]._4_4_;
      local_5e0 = local_5e0 ^ (ulong)uVar14 * (auVar17._0_8_ & 0xffffffff);
      uStack_5d8 = uStack_5d8 ^ (auVar10._8_8_ & 0xffffffff) * (auVar17._8_8_ & 0xffffffff);
      uVar5 = local_5b0 + local_610[0];
      uVar4 = uStack_5a8 + local_610[1];
      local_5d0 = local_5d0 ^ (local_610[0] >> 0x20) * (auVar23._0_8_ & 0xffffffff);
      uStack_5c8 = uStack_5c8 ^ (local_610[1] >> 0x20) * (auVar23._8_8_ & 0xffffffff);
      uVar13 = local_620[0] + local_5c0;
      uVar15 = local_620[1] + uStack_5b8;
      uVar14 = (uint)(auVar17._0_8_ >> 0x20);
      uVar19 = (undefined4)(auVar17._8_8_ >> 0x20);
      auVar11._4_4_ = uVar14;
      auVar11._0_4_ = uVar14;
      auVar11._8_4_ = uVar19;
      auVar11._12_4_ = uVar19;
      local_5c0 = local_5c0 ^ (ulong)uVar14 * (uVar13 & 0xffffffff);
      uStack_5b8 = uStack_5b8 ^ (auVar11._8_8_ & 0xffffffff) * (uVar15 & 0xffffffff);
      local_5b0 = local_5b0 ^ (auVar23._0_8_ >> 0x20) * (uVar5 & 0xffffffff);
      uStack_5a8 = uStack_5a8 ^ (auVar23._8_8_ >> 0x20) * (uVar4 & 0xffffffff);
      auVar6 = pshufb(auVar17,_DAT_00113230);
      local_620[0] = uVar13 + auVar6._0_8_;
      local_620[1] = uVar15 + auVar6._8_8_;
      auVar6 = pshufb(auVar23,_DAT_00113230);
      local_610[0] = auVar6._0_8_ + uVar5;
      local_610[1] = auVar6._8_8_ + uVar4;
      auVar6 = pshufb((undefined1  [16])local_620,_DAT_00113230);
      local_600 = auVar17._0_8_ + auVar6._0_8_;
      lStack_5f8 = auVar17._8_8_ + auVar6._8_8_;
      auVar6 = pshufb((undefined1  [16])local_610,_DAT_00113230);
      local_5f0 = auVar23._0_8_ + auVar6._0_8_;
      lStack_5e8 = auVar23._8_8_ + auVar6._8_8_;
      plVar2 = plVar2 + 4;
      uVar5 = local_5a0 - 0x20;
    }
    if (local_5a0 == 0) {
      sVar3 = 0;
    }
    else {
      memcpy(local_640,plVar2,local_5a0);
      sVar3 = local_5a0;
    }
  }
  local_500.v0L.v_[0] = local_620[0];
  local_500.v0L.v_[1] = local_620[1];
  local_500.v0H.v_[0] = local_610[0];
  local_500.v0H.v_[1] = local_610[1];
  local_500.v1L.v_[0] = local_600;
  local_500.v1L.v_[1] = lStack_5f8;
  local_500.v1H.v_[0] = local_5f0;
  local_500.v1H.v_[1] = lStack_5e8;
  local_500.mul0L.v_[0] = local_5e0;
  local_500.mul0L.v_[1] = uStack_5d8;
  local_500.mul0H.v_[0] = local_5d0;
  local_500.mul0H.v_[1] = uStack_5c8;
  local_500.mul1L.v_[0] = local_5c0;
  local_500.mul1L.v_[1] = uStack_5b8;
  local_500.mul1H.v_[0] = local_5b0;
  local_500.mul1H.v_[1] = uStack_5a8;
  if (sVar3 != 0) {
    SSE41::HHStateSSE41::UpdateRemainder(&local_500,local_640,sVar3);
    local_620 = local_500.v0L.v_;
    local_610 = local_500.v0H.v_;
    local_5f0 = local_500.v1H.v_[0];
    lStack_5e8 = local_500.v1H.v_[1];
    local_5b0 = local_500.mul1H.v_[0];
    uStack_5a8 = local_500.mul1H.v_[1];
    local_5e0 = local_500.mul0L.v_[0];
    uStack_5d8 = local_500.mul0L.v_[1];
    local_5d0 = local_500.mul0H.v_[0];
    uStack_5c8 = local_500.mul0H.v_[1];
    local_600 = local_500.v1L.v_[0];
    lStack_5f8 = local_500.v1L.v_[1];
    local_5c0 = local_500.mul1L.v_[0];
    uStack_5b8 = local_500.mul1L.v_[1];
  }
  iVar1 = 4;
  do {
    auVar12._0_8_ = CONCAT44((int)local_620[0],local_620[0]._4_4_);
    auVar12._8_4_ = local_620[1]._4_4_;
    auVar12._12_4_ = (int)local_620[1];
    auVar37._0_8_ = CONCAT44((int)local_610[0],local_610[0]._4_4_);
    auVar37._8_4_ = local_610[1]._4_4_;
    auVar37._12_4_ = (int)local_610[1];
    auVar34._0_8_ = local_600 + local_5e0 + auVar37._0_8_;
    auVar34._8_8_ = lStack_5f8 + uStack_5d8 + auVar37._8_8_;
    auVar8._0_8_ = local_5f0 + local_5d0 + auVar12._0_8_;
    auVar8._8_8_ = lStack_5e8 + uStack_5c8 + auVar12._8_8_;
    local_5e0 = (ulong)local_620[0]._4_4_ * (auVar34._0_8_ & 0xffffffff) ^ local_5e0;
    uStack_5d8 = (auVar12._8_8_ & 0xffffffff) * (auVar34._8_8_ & 0xffffffff) ^ uStack_5d8;
    uVar13 = local_5b0 + local_610[0];
    uVar15 = uStack_5a8 + local_610[1];
    local_5d0 = local_5d0 ^ (local_610[0] >> 0x20) * (auVar8._0_8_ & 0xffffffff);
    uStack_5c8 = uStack_5c8 ^ (local_610[1] >> 0x20) * (auVar8._8_8_ & 0xffffffff);
    uVar5 = local_620[0] + local_5c0;
    uVar4 = local_620[1] + uStack_5b8;
    uVar14 = (uint)(auVar34._0_8_ >> 0x20);
    uVar19 = (undefined4)(auVar34._8_8_ >> 0x20);
    auVar29._4_4_ = uVar14;
    auVar29._0_4_ = uVar14;
    auVar29._8_4_ = uVar19;
    auVar29._12_4_ = uVar19;
    local_5c0 = (ulong)uVar14 * (uVar5 & 0xffffffff) ^ local_5c0;
    uStack_5b8 = (auVar29._8_8_ & 0xffffffff) * (uVar4 & 0xffffffff) ^ uStack_5b8;
    local_5b0 = local_5b0 ^ (auVar8._0_8_ >> 0x20) * (uVar13 & 0xffffffff);
    uStack_5a8 = uStack_5a8 ^ (auVar8._8_8_ >> 0x20) * (uVar15 & 0xffffffff);
    auVar6 = pshufb(auVar34,_DAT_00113230);
    local_620[0] = auVar6._0_8_ + uVar5;
    local_620[1] = auVar6._8_8_ + uVar4;
    auVar6 = pshufb(auVar8,_DAT_00113230);
    local_610[0] = auVar6._0_8_ + uVar13;
    local_610[1] = auVar6._8_8_ + uVar15;
    auVar6 = pshufb((undefined1  [16])local_620,_DAT_00113230);
    local_600 = auVar6._0_8_ + auVar34._0_8_;
    lStack_5f8 = auVar6._8_8_ + auVar34._8_8_;
    auVar6 = pshufb((undefined1  [16])local_610,_DAT_00113230);
    local_5f0 = auVar8._0_8_ + auVar6._0_8_;
    lStack_5e8 = auVar8._8_8_ + auVar6._8_8_;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return local_620[0] + local_5c0 + local_5e0 + local_600;
}

Assistant:

uint64_t RunHighwayCat(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  HH_ALIGNAS(64) HighwayHashCatT<Target> cat(key);
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  const size_t half_size = size / 2;
  cat.Append(in, half_size);
  cat.Append(in + half_size, size - half_size);
  HHResult64 result;
  cat.Finalize(&result);
  return result;
}